

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H18_stack.c
# Opt level: O3

int main(void)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  
  if (0 < (long)i) {
    i = i + -1;
    __assert_fail("pop(p) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                  ,0x23,"int main()");
  }
  stack[i] = 1.0;
  uVar1 = i + 1;
  if (i == 0) {
    stack[uVar1] = 2.0;
    stack[2] = 3.0;
    i = 0;
    if ((stack[uVar1] == 2.0) && (!NAN(stack[uVar1]))) {
      dVar3 = 0.0;
      iVar2 = 100;
      do {
        if (i < 100) {
          stack[i] = dVar3;
          i = i + 1;
        }
        else {
          puts("Over");
        }
        dVar3 = dVar3 + 1.0;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      if (i < 100) {
        stack[i] = 1.0;
        i = i + 1;
        if (i != -1) {
          __assert_fail("push(1.0) == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                        ,0x35,"int main()");
        }
      }
      else {
        puts("Over");
      }
      return 0;
    }
    __assert_fail("*(p + 1) == 2.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                  ,0x2e,"int main()");
  }
  i = uVar1;
  __assert_fail("push(1.0) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/yahooshiken[P]in-c/H18_stack.c"
                ,0x25,"int main()");
}

Assistant:

int main() {
  double *p = (double *)malloc(sizeof(double) * 3);

  assert(pop(p) == -1);

  assert(push(1.0) == 1);
  assert(push(2.0) == 2);
  assert(push(3.0) == 3);

  assert(pop(p) == 2);
  assert(pop(p + 1) == 1);
  assert(pop(p + 2) == 0);

  assert(*p == 3.0);
  assert(*(p + 1) == 2.0);
  assert(*(p + 2) == 1.0);

  for (int i = 0; i < STACKSIZE; i++) {
    push((double)i);
  }

  assert(push(1.0) == -1);
}